

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void __thiscall
soul::HEARTGenerator::createSeriesOfWrites
          (HEARTGenerator *this,Expression *target,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> values)

{
  FunctionBuilder *pFVar1;
  Context *errorContext;
  EndpointDetails *this_00;
  Expression *pEVar2;
  OutputDeclaration *pOVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  Expression *pEVar7;
  WriteStream *pWVar8;
  ArrayElementRef *pAVar9;
  Expression *args_1;
  int64_t index;
  TypeCast *pTVar10;
  pool_ref<soul::AST::Expression> *ppVar11;
  pool_ref<soul::AST::Expression> *ppVar12;
  ulong intValue;
  uint uVar13;
  SliceRange SVar14;
  Type indexType;
  Type sampleType_1;
  Type sampleType;
  Type local_1d8;
  pool_ref<soul::AST::Expression> *local_1c0;
  CodeLocation local_1b8;
  CodeLocation local_1a8;
  CodeLocation local_198;
  CodeLocation local_188;
  CodeLocation local_178;
  EndpointDetails *local_168;
  ArrayElementRef *local_160;
  pool_ptr<soul::heart::Expression> local_158;
  pool_ptr<soul::heart::Expression> local_150;
  pool_ptr<soul::heart::Expression> local_148;
  pool_ptr<soul::heart::Expression> local_140;
  string local_138;
  undefined1 local_118 [64];
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  ppVar11 = values.e;
  ppVar12 = values.s;
  lVar6 = __dynamic_cast(target,&AST::Expression::typeinfo,&AST::OutputEndpointRef::typeinfo,0);
  local_1c0 = ppVar11;
  if (lVar6 == 0) {
    pAVar9 = (ArrayElementRef *)
             __dynamic_cast(target,&AST::Expression::typeinfo,&AST::ArrayElementRef::typeinfo,0);
    if (((pAVar9 == (ArrayElementRef *)0x0) ||
        (pEVar2 = (pAVar9->object).object, pEVar2 == (Expression *)0x0)) ||
       (lVar6 = __dynamic_cast(pEVar2,&AST::Expression::typeinfo,&AST::OutputEndpointRef::typeinfo,0
                              ), lVar6 == 0)) {
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,"The target for the write operator must be an output");
      AST::Context::throwError(&(target->super_Statement).super_ASTObject.context,&local_a0,false);
    }
    local_168 = *(EndpointDetails **)(*(long *)(lVar6 + 0x30) + 0x38);
    if (local_168 == (EndpointDetails *)0x0) {
LAB_0023ff16:
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    if ((local_168->arraySize).object == (Expression *)0x0) {
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,
                 "Cannot use operator[] to reference endpoints which are not arrays");
      AST::Context::throwError
                (&(pAVar9->super_Expression).super_Statement.super_ASTObject.context,&local_68,false
                );
    }
    if (ppVar12 != ppVar11) {
      pFVar1 = &this->builder;
      local_160 = pAVar9;
      do {
        pAVar9 = local_160;
        pEVar2 = ppVar12->object;
        AST::EndpointDetails::getElementDataType((Type *)&local_138,local_168,pEVar2);
        pEVar7 = evaluateAsExpression(this,pEVar2,(Type *)&local_138);
        if (pAVar9->isSlice == true) {
          SVar14 = AST::ArrayElementRef::getResolvedSliceRange(pAVar9);
          intValue = SVar14.start;
          if (intValue < SVar14.end) {
            do {
              lVar4 = *(long *)(lVar6 + 0x30);
              local_188.sourceCode.object = *(SourceCodeText **)(lVar4 + 0x10);
              if (local_188.sourceCode.object != (SourceCodeText *)0x0) {
                ((local_188.sourceCode.object)->super_RefCountedObject).refCount =
                     ((local_188.sourceCode.object)->super_RefCountedObject).refCount + 1;
              }
              local_188.location.data = *(char **)(lVar4 + 0x18);
              pOVar3 = *(OutputDeclaration **)(lVar4 + 0x70);
              if (pOVar3 == (OutputDeclaration *)0x0) {
                throwInternalCompilerError("object != nullptr","operator*",0x3b);
              }
              local_148.object =
                   &BlockBuilder::createConstantInt32<unsigned_long>
                              (&pFVar1->super_BlockBuilder,intValue)->super_Expression;
              pWVar8 = PoolAllocator::
                       allocate<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                                 (&((this->builder).super_BlockBuilder.module)->allocator->pool,
                                  &local_188,pOVar3,&local_148,pEVar7);
              (*(pFVar1->super_BlockBuilder)._vptr_BlockBuilder[2])(pFVar1,pWVar8);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_188.sourceCode.object);
              intValue = intValue + 1;
            } while (SVar14.end != intValue);
          }
        }
        else {
          pEVar2 = (pAVar9->startIndex).object;
          if (pEVar2 == (Expression *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
          args_1 = evaluateAsExpression(this,pEVar2);
          pEVar2 = (pAVar9->startIndex).object;
          if (pEVar2 == (Expression *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          (*(args_1->super_Object)._vptr_Object[7])(local_118,args_1);
          lVar4 = *(long *)(*(long *)(lVar6 + 0x30) + 0x70);
          if (lVar4 == 0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          uVar13 = 1;
          if (*(char *)(lVar4 + 0x44) != '\0') {
            uVar13 = *(uint *)(lVar4 + 0x40);
          }
          errorContext = &(pEVar2->super_Statement).super_ASTObject.context;
          if (local_118[0] == invalid) {
            if (0x7ffffffd < uVar13 - 1) {
              throwInternalCompilerError("isLegalBoundedIntSize (size)","createWrappedInt",0x165);
            }
            local_1d8.category = wrap;
            local_1d8.arrayElementCategory = invalid;
            local_1d8.isRef = false;
            local_1d8.isConstant = false;
            local_1d8.arrayElementBoundingSize = 0;
            local_1d8.structure.object._0_1_ = 0;
            local_1d8.structure.object._1_7_ = 0;
            local_1d8.primitiveType.type = int32;
            local_1a8.sourceCode.object = (errorContext->location).sourceCode.object;
            if (local_1a8.sourceCode.object != (SourceCodeText *)0x0) {
              ((local_1a8.sourceCode.object)->super_RefCountedObject).refCount =
                   ((local_1a8.sourceCode.object)->super_RefCountedObject).refCount + 1;
            }
            local_1a8.location.data =
                 (pEVar2->super_Statement).super_ASTObject.context.location.location.data;
            local_1d8.boundingSize = uVar13;
            pTVar10 = PoolAllocator::
                      allocate<soul::heart::TypeCast,soul::CodeLocation,soul::heart::Expression&,soul::Type_const&>
                                (&((this->builder).super_BlockBuilder.module)->allocator->pool,
                                 &local_1a8,args_1,&local_1d8);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1a8.sourceCode.object);
            lVar4 = *(long *)(lVar6 + 0x30);
            local_1b8.sourceCode.object = *(SourceCodeText **)(lVar4 + 0x10);
            if (local_1b8.sourceCode.object != (SourceCodeText *)0x0) {
              ((local_1b8.sourceCode.object)->super_RefCountedObject).refCount =
                   ((local_1b8.sourceCode.object)->super_RefCountedObject).refCount + 1;
            }
            local_1b8.location.data = *(char **)(lVar4 + 0x18);
            if (*(OutputDeclaration **)(lVar4 + 0x70) == (OutputDeclaration *)0x0) {
              throwInternalCompilerError("object != nullptr","operator*",0x3b);
            }
            local_158.object = &pTVar10->super_Expression;
            pWVar8 = PoolAllocator::
                     allocate<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                               (&((this->builder).super_BlockBuilder.module)->allocator->pool,
                                &local_1b8,*(OutputDeclaration **)(lVar4 + 0x70),&local_158,pEVar7);
            (*(pFVar1->super_BlockBuilder)._vptr_BlockBuilder[2])(pFVar1,pWVar8);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1b8.sourceCode.object);
            RefCountedPtr<soul::Structure>::decIfNotNull
                      ((Structure *)
                       CONCAT71(local_1d8.structure.object._1_7_,local_1d8.structure.object._0_1_));
          }
          else {
            index = TypeRules::checkAndGetArrayIndex<soul::AST::Context&>
                              (errorContext,(Value *)local_118);
            TypeRules::checkConstantArrayIndex<soul::AST::Context&>
                      (errorContext,index,(ulong)uVar13);
            lVar4 = *(long *)(lVar6 + 0x30);
            local_198.sourceCode.object = *(SourceCodeText **)(lVar4 + 0x10);
            if (local_198.sourceCode.object != (SourceCodeText *)0x0) {
              ((local_198.sourceCode.object)->super_RefCountedObject).refCount =
                   ((local_198.sourceCode.object)->super_RefCountedObject).refCount + 1;
            }
            local_198.location.data = *(char **)(lVar4 + 0x18);
            pOVar3 = *(OutputDeclaration **)(lVar4 + 0x70);
            if (pOVar3 == (OutputDeclaration *)0x0) {
              throwInternalCompilerError("object != nullptr","operator*",0x3b);
            }
            local_150.object =
                 &BlockBuilder::createConstantInt32<long>(&pFVar1->super_BlockBuilder,index)->
                  super_Expression;
            pWVar8 = PoolAllocator::
                     allocate<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                               (&((this->builder).super_BlockBuilder.module)->allocator->pool,
                                &local_198,pOVar3,&local_150,pEVar7);
            (*(pFVar1->super_BlockBuilder)._vptr_BlockBuilder[2])(pFVar1,pWVar8);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_198.sourceCode.object);
          }
          soul::Value::~Value((Value *)local_118);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull
                  ((Structure *)local_138.field_2._M_allocated_capacity);
        ppVar12 = ppVar12 + 1;
      } while (ppVar12 != local_1c0);
    }
  }
  else if (ppVar12 != ppVar11) {
    pFVar1 = &this->builder;
    do {
      this_00 = *(EndpointDetails **)(*(long *)(lVar6 + 0x30) + 0x38);
      if (this_00 == (EndpointDetails *)0x0) goto LAB_0023ff16;
      pEVar2 = ppVar12->object;
      bVar5 = AST::EndpointDetails::supportsDataType(this_00,pEVar2);
      if (!bVar5) {
        (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_1d8,pEVar2);
        Type::getDescription_abi_cxx11_((string *)local_118,&local_1d8);
        AST::EndpointDetails::getTypesDescription_abi_cxx11_(&local_138,this_00);
        CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                  (&local_d8,(CompileMessageHelpers *)0x1,none,0x2a31cf,local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        AST::Context::throwError(&(target->super_Statement).super_ASTObject.context,&local_d8,false)
        ;
      }
      AST::EndpointDetails::getDataType((Type *)local_118,this_00,pEVar2);
      local_178.sourceCode.object = *(SourceCodeText **)(lVar6 + 0x10);
      if (local_178.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_178.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_178.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_178.location.data = *(char **)(lVar6 + 0x18);
      pOVar3 = *(OutputDeclaration **)(*(long *)(lVar6 + 0x30) + 0x70);
      if (pOVar3 == (OutputDeclaration *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      local_140.object = (Expression *)0x0;
      pEVar7 = evaluateAsExpression(this,pEVar2,(Type *)local_118);
      pWVar8 = PoolAllocator::
               allocate<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                         (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_178,
                          pOVar3,&local_140,pEVar7);
      (*(pFVar1->super_BlockBuilder)._vptr_BlockBuilder[2])(pFVar1,pWVar8);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_178.sourceCode.object);
      ppVar11 = local_1c0;
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_118._16_8_);
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 != ppVar11);
  }
  return;
}

Assistant:

void createSeriesOfWrites (AST::Expression& target, ArrayView<pool_ref<AST::Expression>> values)
    {
        // Two choices - the target can be an output declaration, or an element of an output declaration
        if (auto output = cast<AST::OutputEndpointRef> (target))
        {
            for (auto v : values)
            {
                const auto& details = output->output->getDetails();

                if (! details.supportsDataType (v))
                    target.context.throwError (Errors::cannotWriteTypeToEndpoint (v->getResultType().getDescription(),
                                                                                  details.getTypesDescription()));

                auto sampleType = details.getDataType (v);

                builder.addWriteStream (output->context.location,
                                        *output->output->generatedOutput, nullptr,
                                        evaluateAsExpression (v, sampleType));
            }

            return;
        }

        if (auto arraySubscript = cast<AST::ArrayElementRef> (target))
        {
            if (auto outputRef = cast<AST::OutputEndpointRef> (arraySubscript->object))
            {
                const auto& details = outputRef->output->getDetails();

                if (details.arraySize == nullptr)
                    arraySubscript->context.throwError (Errors::cannotUseBracketsOnNonArrayEndpoint());

                for (auto v : values)
                {
                    // Find the element type that our expression will write to
                    auto sampleType = details.getElementDataType (v);
                    auto& value = evaluateAsExpression (v, sampleType);

                    if (arraySubscript->isSlice)
                    {
                        auto slice = arraySubscript->getResolvedSliceRange();

                        for (auto i = slice.start; i < slice.end; ++i)
                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput,
                                                    builder.createConstantInt32 (i), value);
                    }
                    else
                    {
                        auto& index = evaluateAsExpression (*arraySubscript->startIndex);
                        auto& context = arraySubscript->startIndex->context;
                        auto constIndex = index.getAsConstant();
                        auto arraySize = outputRef->output->generatedOutput->arraySize.value_or (1);

                        if (constIndex.isValid())
                        {
                            auto fixedIndex = TypeRules::checkAndGetArrayIndex (context, constIndex);
                            TypeRules::checkConstantArrayIndex (context, fixedIndex, (Type::ArraySize) arraySize);

                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput,
                                                    builder.createConstantInt32 (fixedIndex), value);
                        }
                        else
                        {
                            auto indexType = Type::createWrappedInt ((Type::BoundedIntSize) arraySize);
                            auto& wrappedIndex = builder.createCast (context.location, index, indexType);

                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput, wrappedIndex, value);
                        }
                    }
                }

                return;
            }
        }

        target.context.throwError (Errors::targetMustBeOutput());
    }